

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeCommand.cxx
# Opt level: O1

bool __thiscall
cmIncludeCommand::InitialPass
          (cmIncludeCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  string *psVar9;
  cmGlobalGenerator *this_00;
  ostream *poVar10;
  size_t sVar11;
  PolicyID id;
  _Alloc_hider value;
  pointer pbVar12;
  char *__s;
  uint uVar13;
  ulong uVar14;
  MessageType t;
  bool system;
  string fname_abs;
  string fname;
  string resultVarName;
  string listFile;
  bool local_22c;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar12 || 0x80 < (ulong)((long)pbVar1 - (long)pbVar12)) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "called with wrong number of arguments.  include() only takes one file.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  pcVar2 = (pbVar12->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + pbVar12->_M_string_length);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12) < 0x21) {
    bVar6 = false;
    local_22c = false;
  }
  else {
    uVar14 = 1;
    local_22c = false;
    bVar6 = false;
    do {
      uVar13 = (uint)uVar14;
      iVar7 = std::__cxx11::string::compare((char *)(pbVar12 + uVar14));
      if (iVar7 == 0) {
        bVar4 = !bVar6;
        bVar6 = true;
        if (bVar4) goto LAB_001b7800;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"called with invalid arguments: OPTIONAL used twice","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
LAB_001b7b60:
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_001b7b6d:
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
LAB_001b7b7d:
        bVar4 = false;
        goto LAB_001b7e38;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar14));
      if (iVar7 == 0) {
        if (local_1c8._M_string_length == 0) {
          uVar13 = uVar13 + 1;
          if ((ulong)uVar13 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&local_1c8);
            goto LAB_001b7800;
          }
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"called with no value for RESULT_VARIABLE.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        }
        else {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,
                     "called with invalid arguments: only one result variable allowed","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        }
        goto LAB_001b7b60;
      }
      iVar7 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar14));
      if (iVar7 != 0) {
        if (uVar13 < 2) goto LAB_001b7800;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"called with invalid argument: ","");
        std::__cxx11::string::_M_append
                  (local_1a8,
                   (ulong)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_001b7b6d;
        goto LAB_001b7b7d;
      }
      local_22c = true;
LAB_001b7800:
      uVar14 = (ulong)(uVar13 + 1);
      pbVar12 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5
                             ));
  }
  if (local_1e8._M_string_length == 0) {
    pcVar3 = (this->super_cmCommand).Makefile;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"include() given empty file name (ignored).","");
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar4 = true;
    goto LAB_001b7e38;
  }
  bVar4 = cmsys::SystemTools::FileIsFullPath(&local_1e8);
  if (!bVar4) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    cmMakefile::GetModulesFile
              (&local_208,(this->super_cmCommand).Makefile,(string *)local_1a8,(bool *)&local_228);
    if (local_208._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_1e8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
  cmsys::SystemTools::CollapseFullPath(&local_208,&local_1e8,psVar9);
  this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
  bVar4 = cmGlobalGenerator::IsExportedTargetsFile(this_00,&local_208);
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    t = AUTHOR_WARNING;
    PVar8 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0024,false);
    if (PVar8 - NEW < 3) {
      t = FATAL_ERROR;
      bVar5 = true;
      __s = "may";
      bVar4 = false;
    }
    else if (PVar8 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_228,(cmPolicies *)0x18,id);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                           local_228._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      bVar4 = false;
      __s = "should";
      bVar5 = false;
      t = AUTHOR_WARNING;
    }
    else {
      bVar4 = true;
      __s = (char *)0x0;
      bVar5 = false;
    }
    if (bVar4) {
LAB_001b7ca2:
      cmGlobalGenerator::CreateGenerationObjects(this_00,AllTargets);
      cmGlobalGenerator::GenerateImportFile(this_00,&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_001b7cde;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The file\n  ",0xb);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\nwas generated by the export() command.  It ",0x2c);
    sVar11 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               " not be used as the argument to the include() command.  Use ALIAS targets instead to refer to targets by alternative names.\n"
               ,0x7c);
    pcVar3 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar3,t,&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) goto LAB_001b7ca2;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar4 = false;
  }
  else {
LAB_001b7cde:
    psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_1e8,psVar9);
    if ((!bVar6) || (bVar4 = cmsys::SystemTools::FileExists((string *)local_1a8), bVar4)) {
      bVar5 = cmMakefile::ReadDependentFile
                        ((this->super_cmCommand).Makefile,(string *)local_1a8,local_22c);
      if (local_1c8._M_string_length != 0) {
        value._M_p = local_208._M_dataplus._M_p;
        if (!bVar5) {
          value._M_p = "NOTFOUND";
        }
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_1c8,value._M_p);
      }
      bVar4 = true;
      if (((!bVar5 && !bVar6) && (cmSystemTools::s_FatalErrorOccured == false)) &&
         (bVar6 = cmSystemTools::GetInterruptFlag(), !bVar6)) {
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,"could not find load file:\n  ","");
        std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1e8._M_dataplus._M_p);
        cmCommand::SetError(&this->super_cmCommand,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        bVar4 = false;
      }
    }
    else {
      bVar4 = true;
      if (local_1c8._M_string_length != 0) {
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_1c8,"NOTFOUND");
      }
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
LAB_001b7e38:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmIncludeCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty() || args.size() > 4) {
    this->SetError("called with wrong number of arguments.  "
                   "include() only takes one file.");
    return false;
  }
  bool optional = false;
  bool noPolicyScope = false;
  std::string fname = args[0];
  std::string resultVarName;

  for (unsigned int i = 1; i < args.size(); i++) {
    if (args[i] == "OPTIONAL") {
      if (optional) {
        this->SetError("called with invalid arguments: OPTIONAL used twice");
        return false;
      }
      optional = true;
    } else if (args[i] == "RESULT_VARIABLE") {
      if (!resultVarName.empty()) {
        this->SetError("called with invalid arguments: "
                       "only one result variable allowed");
        return false;
      }
      if (++i < args.size()) {
        resultVarName = args[i];
      } else {
        this->SetError("called with no value for RESULT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "NO_POLICY_SCOPE") {
      noPolicyScope = true;
    } else if (i > 1) // compat.: in previous cmake versions the second
                      // parameter was ignored if it wasn't "OPTIONAL"
    {
      std::string errorText = "called with invalid argument: ";
      errorText += args[i];
      this->SetError(errorText);
      return false;
    }
  }

  if (fname.empty()) {
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING,
                                 "include() given empty file name (ignored).");
    return true;
  }

  if (!cmSystemTools::FileIsFullPath(fname)) {
    // Not a path. Maybe module.
    std::string module = fname;
    module += ".cmake";
    std::string mfile = this->Makefile->GetModulesFile(module);
    if (!mfile.empty()) {
      fname = mfile;
    }
  }

  std::string fname_abs = cmSystemTools::CollapseFullPath(
    fname, this->Makefile->GetCurrentSourceDirectory());

  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
  if (gg->IsExportedTargetsFile(fname_abs)) {
    const char* modal = nullptr;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;

    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0024)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0024) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        modal = "may";
        messageType = MessageType::FATAL_ERROR;
    }
    if (modal) {
      e << "The file\n  " << fname_abs
        << "\nwas generated by the export() "
           "command.  It "
        << modal
        << " not be used as the argument to the "
           "include() command.  Use ALIAS targets instead to refer to targets "
           "by alternative names.\n";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
    gg->CreateGenerationObjects();
    gg->GenerateImportFile(fname_abs);
  }

  std::string listFile = cmSystemTools::CollapseFullPath(
    fname, this->Makefile->GetCurrentSourceDirectory());
  if (optional && !cmSystemTools::FileExists(listFile)) {
    if (!resultVarName.empty()) {
      this->Makefile->AddDefinition(resultVarName, "NOTFOUND");
    }
    return true;
  }

  bool readit = this->Makefile->ReadDependentFile(listFile, noPolicyScope);

  // add the location of the included file if a result variable was given
  if (!resultVarName.empty()) {
    this->Makefile->AddDefinition(resultVarName,
                                  readit ? fname_abs.c_str() : "NOTFOUND");
  }

  if (!optional && !readit && !cmSystemTools::GetFatalErrorOccured()) {
    std::string m = "could not find load file:\n"
                    "  ";
    m += fname;
    this->SetError(m);
    return false;
  }
  return true;
}